

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O0

void __thiscall fat::print_file_clusters(fat *this,string *file_path)

{
  int32_t iVar1;
  ostream *poVar2;
  int32_t local_60;
  int32_t curr_cluster;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  int32_t local_38;
  char local_31;
  int32_t found_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  string *file_path_local;
  fat *this_local;
  
  local_31 = '/';
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = file_path;
  explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&found_file,this,file_path,&local_31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&found_file);
  iVar1 = get_file_start(this,&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  local_38 = iVar1;
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"PATH NOT FOUND");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)file_path);
    poVar2 = std::operator<<(poVar2,": ");
    std::ostream::operator<<(poVar2,local_38);
    for (local_60 = local_38; this->fat_table[local_60] != this->FAT_FILE_END;
        local_60 = this->fat_table[local_60]) {
      poVar2 = std::operator<<((ostream *)&std::cout,", ");
      std::ostream::operator<<(poVar2,this->fat_table[local_60]);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&found_file);
  return;
}

Assistant:

void fat::print_file_clusters(std::string file_path) {
    std::vector<std::string> result = explode(file_path, '/');
    int32_t found_file = get_file_start(result);
    if (found_file != 0) {
        std::cout << file_path << ": " << found_file;
        int32_t curr_cluster = found_file;
        while (fat_table[curr_cluster] != FAT_FILE_END) {
            std::cout << ", " << fat_table[curr_cluster];
            curr_cluster = fat_table[curr_cluster];
        }
        std::cout << std::endl;
    } else {
        std::cout << "PATH NOT FOUND" << std::endl;
    }
}